

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvKrylovDemo_ls.c
# Opt level: O0

UserData AllocUserData(void)

{
  UserData paVar1;
  sunrealtype **ppsVar2;
  sunindextype *psVar3;
  UserData data;
  int jy;
  int jx;
  int local_8;
  int local_4;
  
  paVar1 = (UserData)malloc(0x9a8);
  for (local_4 = 0; local_4 < 10; local_4 = local_4 + 1) {
    for (local_8 = 0; local_8 < 10; local_8 = local_8 + 1) {
      ppsVar2 = (sunrealtype **)SUNDlsMat_newDenseMat(2);
      paVar1->P[local_4][local_8] = ppsVar2;
      ppsVar2 = (sunrealtype **)SUNDlsMat_newDenseMat(2);
      paVar1->Jbd[local_4][local_8] = ppsVar2;
      psVar3 = (sunindextype *)SUNDlsMat_newIndexArray(2);
      paVar1->pivot[local_4][local_8] = psVar3;
    }
  }
  return paVar1;
}

Assistant:

static UserData AllocUserData(void)
{
  int jx, jy;
  UserData data;

  data = (UserData)malloc(sizeof *data);

  for (jx = 0; jx < MX; jx++)
  {
    for (jy = 0; jy < MY; jy++)
    {
      (data->P)[jx][jy]     = SUNDlsMat_newDenseMat(NUM_SPECIES, NUM_SPECIES);
      (data->Jbd)[jx][jy]   = SUNDlsMat_newDenseMat(NUM_SPECIES, NUM_SPECIES);
      (data->pivot)[jx][jy] = SUNDlsMat_newIndexArray(NUM_SPECIES);
    }
  }

  return (data);
}